

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined2 *puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined2 *puVar15;
  ulong uVar16;
  bool bVar17;
  
  iVar12 = 1 << ((byte)tableLog & 0x1f);
  uVar5 = tableLog - 5;
  iVar11 = tableLog + 1;
  puVar15 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar4 = 4;
  bVar17 = false;
  puVar9 = (undefined2 *)header;
  uVar13 = 0;
  uVar7 = iVar12 + 1;
  while( true ) {
    if ((int)uVar7 < 2) {
      if ((writeIsSafe == 0) && (puVar15 < puVar9)) {
        return 0xfffffffffffffffe;
      }
      *puVar9 = (short)uVar5;
      if (uVar13 <= maxSymbolValue + 1) {
        return (long)puVar9 + ((long)((iVar4 + 7) / 8) - (long)header);
      }
      return 0xffffffffffffffff;
    }
    if (bVar17) {
      iVar2 = 0;
      uVar14 = uVar13;
      do {
        uVar8 = uVar14;
        iVar10 = iVar2;
        uVar16 = (ulong)uVar8;
        uVar14 = uVar8 + 1;
        iVar2 = iVar10 + 1;
      } while (normalizedCounter[uVar16] == 0);
      uVar3 = uVar13 + 3;
      while (uVar13 = uVar13 + 0x18, uVar13 <= uVar8) {
        if ((writeIsSafe == 0) && (puVar15 < puVar9)) {
          return 0xfffffffffffffffe;
        }
        uVar5 = uVar5 + (0xffff << ((byte)iVar4 & 0x1f));
        *puVar9 = (short)uVar5;
        puVar9 = puVar9 + 1;
        uVar5 = uVar5 >> 0x10;
        iVar10 = iVar10 + -0x18;
        uVar3 = uVar3 + 0x18;
      }
      for (; uVar3 <= uVar8; uVar3 = uVar3 + 3) {
        uVar5 = uVar5 + (3 << ((byte)iVar4 & 0x1f));
        iVar4 = iVar4 + 2;
        iVar10 = iVar10 + -3;
      }
      uVar5 = (iVar10 << ((byte)iVar4 & 0x1f)) + uVar5;
      if (iVar4 < 0xf) {
        iVar4 = iVar4 + 2;
      }
      else {
        if ((writeIsSafe == 0) && (puVar15 < puVar9)) {
          return 0xfffffffffffffffe;
        }
        *puVar9 = (short)uVar5;
        puVar9 = puVar9 + 1;
        uVar5 = uVar5 >> 0x10;
        iVar4 = iVar4 + -0xe;
      }
    }
    else {
      uVar16 = (ulong)uVar13;
      uVar14 = uVar13 + 1;
    }
    iVar10 = (int)normalizedCounter[uVar16];
    iVar2 = -iVar10;
    if (0 < iVar10) {
      iVar2 = iVar10;
    }
    iVar1 = ~uVar7 + iVar12 * 2;
    iVar6 = iVar1;
    if (iVar10 + 1 < iVar12) {
      iVar6 = 0;
    }
    iVar10 = iVar6 + iVar10 + 1;
    bVar17 = iVar10 == 1;
    uVar8 = uVar7 - iVar2;
    if (uVar8 == 0 || (int)uVar7 < iVar2) break;
    uVar5 = (iVar10 << ((byte)iVar4 & 0x1f)) + uVar5;
    iVar4 = (iVar4 + iVar11) - (uint)(iVar10 < iVar1);
    for (; (int)uVar8 < iVar12; iVar12 = iVar12 >> 1) {
      iVar11 = iVar11 + -1;
    }
    uVar13 = uVar14;
    uVar7 = uVar8;
    if (0x10 < iVar4) {
      if (writeIsSafe == 0 && puVar15 < puVar9) {
        return 0xfffffffffffffffe;
      }
      *puVar9 = (short)uVar5;
      puVar9 = puVar9 + 1;
      uVar5 = uVar5 >> 0x10;
      iVar4 = iVar4 + -0x10;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                                       const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                                       unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    bitStream = 0;
    bitCount  = 0;
    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while (remaining>1) {  /* stops at 1 */
        if (previous0) {
            unsigned start = charnum;
            while (!normalizedCounter[charnum]) charnum++;
            while (charnum >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (charnum >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (charnum-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[charnum++];
            int const max = (2*threshold-1)-remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold) count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previous0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    if (charnum > maxSymbolValue + 1) return ERROR(GENERIC);

    return (out-ostart);
}